

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

int N_VConstrMask_Serial(N_Vector c,N_Vector x,N_Vector m)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  int test;
  sunrealtype *md;
  sunrealtype *xd;
  sunrealtype *cd;
  sunrealtype temp;
  sunindextype N;
  sunindextype i;
  N_Vector m_local;
  N_Vector x_local;
  N_Vector c_local;
  
  lVar2 = *x->content;
  lVar3 = *(long *)((long)x->content + 0x10);
  lVar4 = *(long *)((long)c->content + 0x10);
  lVar5 = *(long *)((long)m->content + 0x10);
  temp = 0.0;
  for (i = 0; i < lVar2; i = i + 1) {
    *(undefined8 *)(lVar5 + i * 8) = 0;
    dVar1 = *(double *)(lVar4 + i * 8);
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      if (((ABS(*(double *)(lVar4 + i * 8)) <= 1.5) ||
          (bVar6 = true, 0.0 < *(double *)(lVar3 + i * 8) * *(double *)(lVar4 + i * 8))) &&
         (bVar6 = false, 0.5 < ABS(*(double *)(lVar4 + i * 8)))) {
        bVar6 = *(double *)(lVar3 + i * 8) * *(double *)(lVar4 + i * 8) < 0.0;
      }
      if (bVar6) {
        *(undefined8 *)(lVar5 + i * 8) = 0x3ff0000000000000;
        temp = 1.0;
      }
    }
  }
  return (uint)(temp != 1.0);
}

Assistant:

sunbooleantype N_VConstrMask_Serial(N_Vector c, N_Vector x, N_Vector m)
{
  sunindextype i, N;
  sunrealtype temp;
  sunrealtype *cd, *xd, *md;
  sunbooleantype test;

  cd = xd = md = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  cd = NV_DATA_S(c);
  md = NV_DATA_S(m);

  temp = ZERO;

  for (i = 0; i < N; i++)
  {
    md[i] = ZERO;

    /* Continue if no constraints were set for the variable */
    if (cd[i] == ZERO) { continue; }

    /* Check if a set constraint has been violated */
    test = (SUNRabs(cd[i]) > ONEPT5 && xd[i] * cd[i] <= ZERO) ||
           (SUNRabs(cd[i]) > HALF && xd[i] * cd[i] < ZERO);
    if (test) { temp = md[i] = ONE; }
  }

  /* Return false if any constraint was violated */
  return (temp == ONE) ? SUNFALSE : SUNTRUE;
}